

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

void cvode_emit_interface(void)

{
  Symbol *s;
  int iVar1;
  uint uVar2;
  undefined8 in_RAX;
  List *pLVar3;
  Item *pIVar4;
  Item *pIVar5;
  int i;
  char *pcVar6;
  Item *item;
  Item *pIVar7;
  List **ppLVar8;
  undefined4 uVar9;
  
  if (cvode_not_allowed != 0) {
    lappendstr(defs_list,"\nstatic int _ode_count(int);\n");
    sprintf(buf,
            "\nstatic int _ode_count(int _type){ hoc_execerror(\"%s\", \"cannot be used with CVODE\"); return 0;}\n"
            ,mechname);
    lappendstr(procfunc,buf);
    return;
  }
  if (cvode_emit != 0) {
    lappendstr(defs_list,
               "\nstatic int _ode_count(int);\nstatic void _ode_map(int, double**, double**, double*, Datum*, double*, int);\nstatic void _ode_spec(NrnThread*, Memb_list*, int);\nstatic void _ode_matsol(NrnThread*, Memb_list*, int);\n"
              );
    sprintf(buf,"\nstatic int _ode_count(int _type){ return %d;}\n",(ulong)(uint)cvode_neq_);
    lappendstr(procfunc,buf);
    sprintf(buf,"\n#define _cvode_ieq _ppvar[%d]._i\n",(ulong)(uint)cvode_ieq_index);
    lappendstr(defs_list,buf);
    if (cvode_fun_->subtype == 0x80) {
      cvode_proced_emit();
    }
    else {
      lappendstr(procfunc,"\nstatic void _ode_spec(NrnThread* _nt, Memb_list* _ml, int _type) {\n");
      out_nt_ml_frag(procfunc);
      pLVar3 = get_ion_variables(1);
      if (pLVar3->next->itemtype != 0) {
        movelist(pLVar3->next,pLVar3->prev,procfunc);
      }
      sprintf(buf,"    _ode_spec%d",(ulong)(uint)cvode_num_);
      lappendstr(procfunc,buf);
      pIVar4 = lappendstr(procfunc,"();\n");
      vectorize_substitute(pIVar4,"(_threadargs_);\n");
      pLVar3 = set_ion_variables(1);
      if (pLVar3->next->itemtype != 0) {
        movelist(pLVar3->next,pLVar3->prev,procfunc);
      }
      lappendstr(procfunc,"}}\n");
      lappendstr(procfunc,
                 "\nstatic void _ode_map(int _ieq, double** _pv, double** _pvdot, double* _pp, Datum* _ppd, double* _atol, int _type) {"
                );
      pIVar4 = lappendstr(procfunc,"\n");
      vectorize_substitute(pIVar4,"\n\tdouble* _p; Datum* _ppvar;\n");
      sprintf(buf,
              "\tint _i; _p = _pp; _ppvar = _ppd;\n\t_cvode_ieq = _ieq;\n\tfor (_i=0; _i < %d; ++_i) {\n\t\t_pv[_i] = _pp + _slist%d[_i];  _pvdot[_i] = _pp + _dlist%d[_i];\n\t\t_cvode_abstol(_atollist, _atol, _i);\n\t}\n"
              ,(ulong)(uint)cvode_neq_,(ulong)(uint)cvode_num_,(ulong)(uint)cvode_num_);
      lappendstr(procfunc,buf);
      ppLVar8 = &useion;
      while( true ) {
        uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
        if ((*ppLVar8)->next == useion) break;
        pIVar4 = (*ppLVar8)->next->next->next;
        pIVar5 = (pIVar4->element).itm;
        pIVar7 = pIVar5;
        while (pIVar7 = pIVar7->next, pIVar7 != pIVar5) {
          s = (pIVar7->element).sym;
          if ((s->nrntype & 0x1000) != 0) {
            if ((s->subtype & 0x10) == 0) {
              pIVar5 = procfunc;
              if (ion_synonym == (List *)0x0) {
                ion_synonym = newlist();
                pIVar5 = procfunc;
              }
              do {
                pIVar5 = pIVar5->next;
                if (pIVar5 == procfunc) goto LAB_00109bdc;
              } while ((((pIVar5->itemtype != 1) ||
                        ((pIVar5->element).sym != (Symbol *)(pIVar7->element).itm)) ||
                       (item = pIVar5->next, item->itemtype != 1)) ||
                      ((pcVar6 = ((item->element).sym)->name, *pcVar6 != '=' || (pcVar6[1] != '\0'))
                      ));
              sprintf(buf,"_ion_%s = ",((pIVar5->element).sym)->name);
              lappendstr(ion_synonym,buf);
              do {
                item = item->next;
                if (item == procfunc->prev) {
LAB_00109bdc:
                  diag(((pIVar7->element).sym)->name,
                       " is WRITE but is not a STATE and has no assignment statement");
                }
                lappenditem(ion_synonym,item);
              } while ((item->itemtype != 1) || ((Symbol *)(item->element).itm != semi));
            }
            else {
              uVar2 = slist_search(cvode_num_,s);
              sprintf(buf,"\t_pv[%d] = &(_ion_%s);\n",(ulong)uVar2,((pIVar7->element).sym)->name);
              lappendstr(procfunc,buf);
            }
          }
          pIVar5 = (pIVar4->element).itm;
        }
        ppLVar8 = &pIVar4->next;
      }
      lappendstr(procfunc,"}\n");
      if (ion_synonym != (List *)0x0) {
        lappendstr(defs_list,"static void _ode_synonym(int, double**, Datum**);\n");
        lappendstr(procfunc,"static void _ode_synonym(int _cnt, double** _pp, Datum** _ppd) {");
        pIVar4 = lappendstr(procfunc,"\n");
        vectorize_substitute(pIVar4,"\n\tdouble* _p; Datum* _ppvar;\n");
        lappendstr(procfunc,
                   "\tint _i; \n\tfor (_i=0; _i < _cnt; ++_i) {_p = _pp[_i]; _ppvar = _ppd[_i];\n");
        movelist(ion_synonym->next,ion_synonym->prev,procfunc);
        lappendstr(procfunc,"}}\n");
      }
      lappendstr(procfunc,"\nstatic void _ode_matsol(NrnThread* _nt, Memb_list* _ml, int _type) {\n"
                );
      out_nt_ml_frag(procfunc);
      pLVar3 = get_ion_variables(1);
      if (pLVar3->next->itemtype != 0) {
        movelist(pLVar3->next,pLVar3->prev,procfunc);
      }
      iVar1 = cvode_num_;
      if (cvode_fun_->subtype == 0x400) {
        sprintf(buf,"_cvode_sparse(&_cvsparseobj%d, %d, _dlist%d, _p, _ode_matsol%d, &_coef%d);\n",
                (ulong)(uint)cvode_num_,(ulong)(uint)cvode_neq_,(ulong)(uint)cvode_num_,
                (ulong)(uint)cvode_num_,CONCAT44(uVar9,cvode_num_));
        lappendstr(procfunc,buf);
        sprintf(buf,
                "_cvode_sparse_thread(&_thread[_cvspth%d]._pvoid, %d, _dlist%d, _p, _ode_matsol%d, _ppvar, _thread, _nt);\n"
                ,(ulong)(uint)iVar1,(ulong)(uint)cvode_neq_,(ulong)(uint)iVar1,(ulong)(uint)iVar1);
        pIVar4 = procfunc->prev;
        pcVar6 = buf;
      }
      else {
        sprintf(buf,"_ode_matsol%d",(ulong)(uint)cvode_num_);
        lappendstr(procfunc,buf);
        pIVar4 = lappendstr(procfunc,"();\n");
        pcVar6 = "(_threadargs_);\n";
      }
      vectorize_substitute(pIVar4,pcVar6);
      lappendstr(procfunc,"}}\n");
    }
    pIVar5 = state_discon_list_;
    pIVar4 = state_discon_list_;
    if (state_discon_list_ != (List *)0x0) {
      while (pIVar4 = pIVar4->next, pIVar4 != pIVar5) {
        pIVar7 = (pIVar4->element).itm;
        if ((pIVar7->itemtype == 1) && ((((pIVar7->element).sym)->subtype & 0x10) != 0)) {
          uVar2 = slist_search(cvode_num_,(pIVar7->element).sym);
          sprintf(buf,"_cvode_ieq + %d, &",(ulong)uVar2);
          replacstr(pIVar7->prev,buf);
          pIVar5 = state_discon_list_;
        }
      }
    }
  }
  return;
}

Assistant:

void cvode_emit_interface() {
	List* lst;
	Item* q, *q1;
	if (cvode_not_allowed) {
		Lappendstr(defs_list, "\n\
static int _ode_count(int);\n");
		sprintf(buf, "\n\
static int _ode_count(int _type){ hoc_execerror(\"%s\", \"cannot be used with CVODE\"); return 0;}\n",
			mechname);
		Lappendstr(procfunc, buf);
	}else if (cvode_emit) {

		Lappendstr(defs_list, "\n\
static int _ode_count(int);\n\
static void _ode_map(int, double**, double**, double*, Datum*, double*, int);\n\
static void _ode_spec(NrnThread*, Memb_list*, int);\n\
static void _ode_matsol(NrnThread*, Memb_list*, int);\n\
");
		sprintf(buf, "\n\
static int _ode_count(int _type){ return %d;}\n",
			cvode_neq_);
		Lappendstr(procfunc, buf);
		sprintf(buf, "\n#define _cvode_ieq _ppvar[%d]._i\n",cvode_ieq_index);
		Lappendstr(defs_list, buf);

   if (cvode_fun_->subtype == PROCED) {
	cvode_proced_emit();
   }else{
		Lappendstr(procfunc, "\nstatic void _ode_spec(NrnThread* _nt, Memb_list* _ml, int _type) {\n");
		out_nt_ml_frag(procfunc);
		lst = get_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		sprintf(buf,"    _ode_spec%d", cvode_num_);
		Lappendstr(procfunc, buf);
		vectorize_substitute(lappendstr(procfunc, "();\n"), "(_threadargs_);\n");
		lst = set_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		Lappendstr(procfunc, "}}\n");

		Lappendstr(procfunc, "\n\
static void _ode_map(int _ieq, double** _pv, double** _pvdot, double* _pp, Datum* _ppd, double* _atol, int _type) {");
		vectorize_substitute(lappendstr(procfunc, "\n"), "\n\
	double* _p; Datum* _ppvar;\n");
		sprintf(buf, "\
	int _i; _p = _pp; _ppvar = _ppd;\n\
	_cvode_ieq = _ieq;\n\
	for (_i=0; _i < %d; ++_i) {\n\
		_pv[_i] = _pp + _slist%d[_i];  _pvdot[_i] = _pp + _dlist%d[_i];\n\
		_cvode_abstol(_atollist, _atol, _i);\n\
	}\n",
			cvode_neq_, cvode_num_, cvode_num_);
		Lappendstr(procfunc, buf);
/* need to take care of case where a state is an ion concentration. Replace
the _pp pointer with a pointer to the actual ion model's concentration */
		cvode_conc_map();
		Lappendstr(procfunc, "}\n"); 
		if (ion_synonym) {
			Lappendstr(defs_list, "static void _ode_synonym(int, double**, Datum**);\n");
			Lappendstr(procfunc, "\
static void _ode_synonym(int _cnt, double** _pp, Datum** _ppd) {");
		vectorize_substitute(lappendstr(procfunc, "\n"), "\n\
	double* _p; Datum* _ppvar;\n");
			Lappendstr(procfunc, "\
	int _i; \n\
	for (_i=0; _i < _cnt; ++_i) {_p = _pp[_i]; _ppvar = _ppd[_i];\n");
			movelist(ion_synonym->next, ion_synonym->prev, procfunc);
			Lappendstr(procfunc, "}}\n");
		}

		Lappendstr(procfunc, "\nstatic void _ode_matsol(NrnThread* _nt, Memb_list* _ml, int _type) {\n");
		out_nt_ml_frag(procfunc);
		lst = get_ion_variables(1);
		if (lst->next->itemtype) movelist(lst->next, lst->prev, procfunc);
		if (cvode_fun_->subtype == KINF) {
			int i = cvode_num_;
sprintf(buf, "_cvode_sparse(&_cvsparseobj%d, %d, _dlist%d, _p, _ode_matsol%d, &_coef%d);\n",
				i, cvode_neq_, i, i, i);
			Lappendstr(procfunc, buf);
sprintf(buf, "_cvode_sparse_thread(&_thread[_cvspth%d]._pvoid, %d, _dlist%d, _p, _ode_matsol%d, _ppvar, _thread, _nt);\n",
				i, cvode_neq_, i, i);
			vectorize_substitute(procfunc->prev, buf);
			
		}else{
			sprintf(buf, "_ode_matsol%d", cvode_num_);
			Lappendstr(procfunc, buf);
			vectorize_substitute(lappendstr(procfunc, "();\n"), "(_threadargs_);\n");
		}
		Lappendstr(procfunc, "}}\n");
	}
	/* handle the state_discontinuities */
	if (state_discon_list_) ITERATE(q, state_discon_list_) {
		Symbol* s;
		int sindex;
		q1 = ITM(q);
		s = SYM(q1);
		if (q1->itemtype == SYMBOL && (s->subtype & STAT)) {
			sindex = slist_search(cvode_num_, s);
			sprintf(buf, "_cvode_ieq + %d, &", sindex);
			replacstr(q1->prev, buf);
		}
	}
   }
}